

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall fasttext::Model::initSigmoid(Model *this)

{
  vector<float,_std::allocator<float>_> *in_RDI;
  real x;
  int i;
  vector<float,_std::allocator<float>_> *__x;
  int local_c;
  
  for (local_c = 0; local_c < 0x201; local_c = local_c + 1) {
    __x = in_RDI + 8;
    std::exp((double)(ulong)(uint)-((float)((long)(local_c << 1) << 3) / 512.0 - 8.0));
    std::vector<float,_std::allocator<float>_>::push_back(in_RDI,(value_type_conflict1 *)__x);
  }
  return;
}

Assistant:

void Model::initSigmoid() {
	for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
		real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
		t_sigmoid_.push_back(1.0 / (1.0 + std::exp(-x)));
	}
}